

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  uint *puVar1;
  pointer pnVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_cc;
  cpp_dec_float<100U,_int,_void> local_c8;
  cpp_dec_float<100U,_int,_void> local_70;
  
  if (this->setupStatus == true) {
    local_cc = i;
    uVar12 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar12 < 0) {
      local_c8.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
      local_c8.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
      local_c8.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
      local_c8.data._M_elems._24_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 6);
      local_c8.data._M_elems._32_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 8);
      local_c8.data._M_elems._40_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 10);
      local_c8.data._M_elems._48_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 0xc);
      local_c8.data._M_elems._56_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 0xe);
      local_c8.exp = (x->m_backend).exp;
      local_c8.neg = (x->m_backend).neg;
      uVar4._0_4_ = (x->m_backend).fpclass;
      uVar4._4_4_ = (x->m_backend).prec_elem;
      if ((local_c8.neg == true) &&
         (local_c8.data._M_elems[0] != 0 || (fpclass_type)uVar4 != cpp_dec_float_finite)) {
        local_c8.neg = false;
      }
      local_c8._72_8_ = uVar4;
      getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_70,this);
      if (((fpclass_type)uVar4 != cpp_dec_float_NaN) && (local_70.fpclass != cpp_dec_float_NaN)) {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_c8,&local_70);
        if (0 < iVar13) {
          IdxSet::add(&this->super_IdxSet,1,&local_cc);
          i = local_cc;
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_c8,0,(type *)0x0);
      if (((x->m_backend).fpclass != cpp_dec_float_NaN) && (local_c8.fpclass != cpp_dec_float_NaN))
      {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&x->m_backend,&local_c8);
        if (iVar13 == 0) {
          pnVar2 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar13 = (this->super_IdxSet).idx[uVar12];
          pnVar2[iVar13].m_backend.fpclass = cpp_dec_float_finite;
          pnVar2[iVar13].m_backend.prec_elem = 0x10;
          *(undefined1 (*) [16])&pnVar2[iVar13].m_backend.data = (undefined1  [16])0x0;
          puVar1 = (uint *)((long)&pnVar2[iVar13].m_backend.data + 0x10);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1 = (uint *)((long)&pnVar2[iVar13].m_backend.data + 0x20);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1 = (uint *)((long)&pnVar2[iVar13].m_backend.data + 0x30);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          *(undefined8 *)((long)&pnVar2[iVar13].m_backend.data + 0x3d) = 0;
          piVar3 = (this->super_IdxSet).idx;
          iVar13 = (this->super_IdxSet).num;
          (this->super_IdxSet).num = iVar13 + -1;
          piVar3[uVar12] = piVar3[(long)iVar13 + -1];
        }
      }
    }
  }
  pnVar2 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(x->m_backend).data._M_elems;
  uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((x->m_backend).data._M_elems + 4);
  uVar7 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
  uVar8 = *(undefined8 *)((x->m_backend).data._M_elems + 8);
  uVar9 = *(undefined8 *)((x->m_backend).data._M_elems + 10);
  uVar10 = *(undefined8 *)((x->m_backend).data._M_elems + 0xe);
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x30);
  *(undefined8 *)puVar1 = *(undefined8 *)((x->m_backend).data._M_elems + 0xc);
  *(undefined8 *)(puVar1 + 2) = uVar10;
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + 2) = uVar7;
  *(undefined8 *)&pnVar2[i].m_backend.data = uVar4;
  *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8) = uVar5;
  pnVar2[i].m_backend.exp = (x->m_backend).exp;
  pnVar2[i].m_backend.neg = (x->m_backend).neg;
  iVar11 = (x->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (x->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar11;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }